

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

int multi_getsock(Curl_easy *data,curl_socket_t *socks)

{
  connectdata *conn;
  _func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *UNRECOVERED_JUMPTABLE;
  int iVar1;
  uint uVar2;
  long lVar3;
  
  conn = data->conn;
  uVar2 = 0;
  if (conn != (connectdata *)0x0) {
    switch(data->mstate) {
    case MSTATE_RESOLVING:
      iVar1 = Curl_resolv_getsock(data,socks);
      return iVar1;
    case MSTATE_CONNECTING:
      if (((conn->http_proxy).proxytype == '\x02') && ((conn->bits).proxy_ssl_connected[0] == false)
         ) {
        iVar1 = (*Curl_ssl->getsock)(conn,socks);
        return iVar1;
      }
      if ((conn->cnnct).state - CONNECT_SOCKS_INIT < 0x10) {
        iVar1 = Curl_SOCKS_getsock(conn,socks,0);
        return iVar1;
      }
      iVar1 = 0;
      uVar2 = 0;
      for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
        if (conn->tempsock[lVar3] != -1) {
          socks[iVar1] = conn->tempsock[lVar3];
          uVar2 = uVar2 | 1 << (iVar1 + 0x10U & 0x1f);
          iVar1 = iVar1 + 1;
        }
      }
      break;
    case MSTATE_TUNNELING:
      *socks = conn->sock[0];
      if (conn->connect_state == (http_connect_state *)0x0) {
        return 0x10000;
      }
      iVar1 = Curl_connect_getsock(conn);
      return iVar1;
    case MSTATE_PROTOCONNECT:
    case MSTATE_PROTOCONNECTING:
      UNRECOVERED_JUMPTABLE = conn->handler->proto_getsock;
      if (UNRECOVERED_JUMPTABLE != (_func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *)0x0)
      {
        iVar1 = (*UNRECOVERED_JUMPTABLE)(data,conn,socks);
        return iVar1;
      }
      *socks = conn->sock[0];
      uVar2 = 0x10001;
      break;
    case MSTATE_DO:
    case MSTATE_DOING:
      UNRECOVERED_JUMPTABLE = conn->handler->doing_getsock;
      if (UNRECOVERED_JUMPTABLE != (_func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *)0x0)
      {
        iVar1 = (*UNRECOVERED_JUMPTABLE)(data,conn,socks);
        return iVar1;
      }
      break;
    case MSTATE_DOING_MORE:
      UNRECOVERED_JUMPTABLE = conn->handler->domore_getsock;
      if (UNRECOVERED_JUMPTABLE != (_func_int_Curl_easy_ptr_connectdata_ptr_curl_socket_t_ptr *)0x0)
      {
        iVar1 = (*UNRECOVERED_JUMPTABLE)(data,conn,socks);
        return iVar1;
      }
      break;
    case MSTATE_DID:
    case MSTATE_PERFORMING:
      iVar1 = Curl_single_getsock(data,conn,socks);
      return iVar1;
    }
  }
  return uVar2;
}

Assistant:

static int multi_getsock(struct Curl_easy *data,
                         curl_socket_t *socks)
{
  struct connectdata *conn = data->conn;
  /* The no connection case can happen when this is called from
     curl_multi_remove_handle() => singlesocket() => multi_getsock().
  */
  if(!conn)
    return 0;

  switch(data->mstate) {
  default:
    return 0;

  case MSTATE_RESOLVING:
    return Curl_resolv_getsock(data, socks);

  case MSTATE_PROTOCONNECTING:
  case MSTATE_PROTOCONNECT:
    return protocol_getsock(data, conn, socks);

  case MSTATE_DO:
  case MSTATE_DOING:
    return doing_getsock(data, conn, socks);

  case MSTATE_TUNNELING:
    return waitproxyconnect_getsock(conn, socks);

  case MSTATE_CONNECTING:
    return waitconnect_getsock(conn, socks);

  case MSTATE_DOING_MORE:
    return domore_getsock(data, conn, socks);

  case MSTATE_DID: /* since is set after DO is completed, we switch to
                        waiting for the same as the PERFORMING state */
  case MSTATE_PERFORMING:
    return Curl_single_getsock(data, conn, socks);
  }

}